

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

SW_FT_Angle SW_FT_Atan2(SW_FT_Fixed dx,SW_FT_Fixed dy)

{
  long in_RSI;
  long in_RDI;
  SW_FT_Vector v;
  SW_FT_Vector local_28 [2];
  SW_FT_Angle local_8;
  
  if ((in_RDI == 0) && (in_RSI == 0)) {
    local_8 = 0;
  }
  else {
    local_28[0].y = in_RSI;
    ft_trig_prenorm(local_28);
    ft_trig_pseudo_polarize(local_28);
    local_8 = local_28[0].y;
  }
  return local_8;
}

Assistant:

SW_FT_Angle SW_FT_Atan2(SW_FT_Fixed dx, SW_FT_Fixed dy)
{
    SW_FT_Vector v;

    if (dx == 0 && dy == 0) return 0;

    v.x = dx;
    v.y = dy;
    ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    return v.y;
}